

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_test.cpp
# Opt level: O3

void __thiscall
GenericExceptionCatcher_Tests::GenericExceptionCatcher_paren_operator_test::test_method
          (GenericExceptionCatcher_paren_operator_test *this)

{
  undefined4 *puVar1;
  GenericExceptionHandler<void,_mittens::UnHandler<int>,_mittens::DefaultNoAction<void>_> allCatcher
  ;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

BOOST_AUTO_TEST_CASE(GenericExceptionCatcher_paren_operator_test)
{
   auto allCatcher = generic_handler<void>(EXIT_FAILURE); 
   {
      try
      {
         throw_int();
      }
      catch (...)
      {
         BOOST_CHECK_EQUAL(EXIT_FAILURE, allCatcher());
      }
   }
}